

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

ParseLocationRange __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocationRange
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  ParseLocationRange PVar1;
  second_type *this_00;
  size_type sVar2;
  const_reference pvVar3;
  vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
  *locations;
  FieldDescriptor *pFStack_28;
  int index_local;
  FieldDescriptor *field_local;
  ParseInfoTree *this_local;
  ParseLocation local_10;
  
  pFStack_28 = field;
  field_local = (FieldDescriptor *)this;
  CheckFieldIndex(field,index);
  locations._4_4_ = index;
  if (index == -1) {
    locations._4_4_ = 0;
  }
  this_00 = FindOrNull<std::map<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>>
                      (&this->locations_,&stack0xffffffffffffffd8);
  if (this_00 != (second_type *)0x0) {
    sVar2 = std::
            vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
            ::size(this_00);
    if ((long)locations._4_4_ < (long)sVar2) {
      pvVar3 = std::
               vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>
               ::operator[](this_00,(long)locations._4_4_);
      this_local = *(ParseInfoTree **)&pvVar3->start;
      local_10 = pvVar3->end;
      goto LAB_00719d30;
    }
  }
  ParseLocationRange::ParseLocationRange((ParseLocationRange *)&this_local);
LAB_00719d30:
  PVar1.end = local_10;
  PVar1.start = (ParseLocation)this_local;
  return PVar1;
}

Assistant:

TextFormat::ParseLocationRange TextFormat::ParseInfoTree::GetLocationRange(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  const std::vector<TextFormat::ParseLocationRange>* locations =
      FindOrNull(locations_, field);
  if (locations == nullptr ||
      index >= static_cast<int64_t>(locations->size())) {
    return TextFormat::ParseLocationRange();
  }

  return (*locations)[index];
}